

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O1

double __thiscall
mp::
PLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
::inverse_1st(PLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
              *this,double y)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (((this->
            super_BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
            ).con_)->
          super_CustomConstraintData<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::PowConstExpId>
          ).params_._M_elems[0];
  dVar1 = pow(ABS(y / dVar1),1.0 / (dVar1 + -1.0));
  dVar2 = BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
          ::lb_sub(&this->
                    super_BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowConstExpId>_>
                  );
  return (double)(~-(ulong)(dVar2 < 0.0) & (ulong)dVar1 | (ulong)-dVar1 & -(ulong)(dVar2 < 0.0));
}

Assistant:

double inverse_1st(double y) const override {
    auto x00 = std::pow(
          std::fabs(y / GetConParams()[0]),
        1.0 / (GetConParams()[0]-1) );
    if (lb_sub()<0.0)           // subinterval before 0
      return -x00;
    return x00;
  }